

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

CURLcode Curl_cpool_upkeep(void *data)

{
  cpool *cpool;
  curltime cVar1;
  curltime now;
  
  cpool = cpool_get_instance((Curl_easy *)data);
  cVar1 = Curl_now();
  now.tv_sec = cVar1.tv_sec;
  now.tv_usec = cVar1.tv_usec;
  if (cpool != (cpool *)0x0) {
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    cpool->field_0x98 = cpool->field_0x98 | 1;
    cpool_foreach((Curl_easy *)data,cpool,&now,conn_upkeep);
    cpool->field_0x98 = cpool->field_0x98 & 0xfe;
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_cpool_upkeep(void *data)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct curltime now = Curl_now();

  if(!cpool)
    return CURLE_OK;

  CPOOL_LOCK(cpool);
  cpool_foreach(data, cpool, &now, conn_upkeep);
  CPOOL_UNLOCK(cpool);
  return CURLE_OK;
}